

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Highs.cpp
# Opt level: O2

HighsStatus __thiscall
Highs::passModel(Highs *this,HighsInt num_col,HighsInt num_row,HighsInt a_num_nz,HighsInt q_num_nz,
                HighsInt a_format,HighsInt q_format,HighsInt sense,double offset,double *costs,
                double *col_lower,double *col_upper,double *row_lower,double *row_upper,
                HighsInt *a_start,HighsInt *a_index,double *a_value,HighsInt *q_start,
                HighsInt *q_index,double *q_value,HighsInt *integrality)

{
  vector<int,_std::allocator<int>_> *this_00;
  bool bVar1;
  HighsInt HVar2;
  HighsStatus HVar3;
  char *format;
  ulong uVar4;
  ulong __new_size;
  HighsModel model;
  HighsModel local_418;
  
  logHeader(this);
  HighsModel::HighsModel(&model);
  bVar1 = aFormatOk(this,a_num_nz,a_format);
  if (bVar1) {
    bVar1 = qFormatOk(this,q_num_nz,q_format);
    if (bVar1) {
      __new_size = (ulong)(uint)num_col;
      model.lp_.num_col_ = num_col;
      model.lp_.num_row_ = num_row;
      if (0 < num_col) {
        std::vector<double,std::allocator<double>>::_M_assign_aux<double_const*>
                  ((vector<double,std::allocator<double>> *)&model.lp_.col_cost_,costs,
                   costs + __new_size);
        std::vector<double,std::allocator<double>>::_M_assign_aux<double_const*>
                  ((vector<double,std::allocator<double>> *)&model.lp_.col_lower_,col_lower,
                   col_lower + __new_size);
        std::vector<double,std::allocator<double>>::_M_assign_aux<double_const*>
                  ((vector<double,std::allocator<double>> *)&model.lp_.col_upper_,col_upper,
                   col_upper + __new_size);
      }
      if (0 < num_row) {
        std::vector<double,std::allocator<double>>::_M_assign_aux<double_const*>
                  ((vector<double,std::allocator<double>> *)&model.lp_.row_lower_,row_lower,
                   row_lower + (uint)num_row);
        std::vector<double,std::allocator<double>>::_M_assign_aux<double_const*>
                  ((vector<double,std::allocator<double>> *)&model.lp_.row_upper_,row_upper,
                   row_upper + (uint)num_row);
      }
      if (a_num_nz < 1) {
LAB_0023189e:
        std::vector<int,_std::allocator<int>_>::resize
                  (&model.lp_.a_matrix_.start_,(long)(num_col + 1));
        model.lp_.a_matrix_.format_ = kColwise;
        num_row = num_col;
      }
      else {
        HVar2 = num_col;
        if (a_format == 2) {
          HVar2 = num_row;
        }
        std::vector<int,std::allocator<int>>::_M_assign_aux<int_const*>
                  ((vector<int,std::allocator<int>> *)&model.lp_.a_matrix_.start_,a_start,
                   a_start + HVar2);
        std::vector<int,std::allocator<int>>::_M_assign_aux<int_const*>
                  ((vector<int,std::allocator<int>> *)&model.lp_.a_matrix_.index_,a_index,
                   a_index + (uint)a_num_nz);
        std::vector<double,std::allocator<double>>::_M_assign_aux<double_const*>
                  ((vector<double,std::allocator<double>> *)&model.lp_.a_matrix_.value_,a_value,
                   a_value + (uint)a_num_nz);
        if (a_num_nz < 1 || a_format != 2) goto LAB_0023189e;
        std::vector<int,_std::allocator<int>_>::resize
                  (&model.lp_.a_matrix_.start_,(long)(num_row + 1));
        model.lp_.a_matrix_.format_ = kRowwise;
      }
      model.lp_.a_matrix_.start_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start[num_row] = a_num_nz;
      model.lp_.sense_ = (uint)(sense != -1) * 2 + kMaximize;
      model.lp_.offset_ = offset;
      if (integrality != (HighsInt *)0x0 && 0 < num_col) {
        std::vector<HighsVarType,_std::allocator<HighsVarType>_>::resize
                  (&model.lp_.integrality_,__new_size);
        for (uVar4 = 0; __new_size != uVar4; uVar4 = uVar4 + 1) {
          if (3 < (uint)integrality[uVar4]) {
            highsLogDev(&(this->options_).super_HighsOptionsStruct.log_options,kError,
                        "Model has illegal integer value of %d for integrality[%d]\n");
            goto LAB_0023187d;
          }
          model.lp_.integrality_.super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>.
          _M_impl.super__Vector_impl_data._M_start[uVar4] = (HighsVarType)integrality[uVar4];
        }
      }
      if (0 < q_num_nz) {
        this_00 = &model.hessian_.start_;
        model.hessian_.format_ = kTriangular;
        model.hessian_.dim_ = num_col;
        std::vector<int,std::allocator<int>>::_M_assign_aux<int_const*>
                  ((vector<int,std::allocator<int>> *)this_00,q_start,q_start + num_col);
        std::vector<int,_std::allocator<int>_>::resize(this_00,(long)(num_col + 1));
        model.hessian_.start_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start[num_col] = q_num_nz;
        std::vector<int,std::allocator<int>>::_M_assign_aux<int_const*>
                  ((vector<int,std::allocator<int>> *)&model.hessian_.index_,q_index,
                   q_index + (uint)q_num_nz);
        std::vector<double,std::allocator<double>>::_M_assign_aux<double_const*>
                  ((vector<double,std::allocator<double>> *)&model.hessian_.value_,q_value,
                   q_value + (uint)q_num_nz);
      }
      HighsModel::HighsModel(&local_418,&model);
      HVar3 = passModel(this,&local_418);
      HighsModel::~HighsModel(&local_418);
      goto LAB_00231880;
    }
    format = "Model has illegal Hessian matrix format\n";
  }
  else {
    format = "Model has illegal constraint matrix format\n";
  }
  highsLogUser(&(this->options_).super_HighsOptionsStruct.log_options,kError,format);
LAB_0023187d:
  HVar3 = kError;
LAB_00231880:
  HighsModel::~HighsModel(&model);
  return HVar3;
}

Assistant:

HighsStatus Highs::passModel(
    const HighsInt num_col, const HighsInt num_row, const HighsInt a_num_nz,
    const HighsInt q_num_nz, const HighsInt a_format, const HighsInt q_format,
    const HighsInt sense, const double offset, const double* costs,
    const double* col_lower, const double* col_upper, const double* row_lower,
    const double* row_upper, const HighsInt* a_start, const HighsInt* a_index,
    const double* a_value, const HighsInt* q_start, const HighsInt* q_index,
    const double* q_value, const HighsInt* integrality) {
  this->logHeader();
  HighsModel model;
  HighsLp& lp = model.lp_;
  // Check that the formats of the constraint matrix and Hessian are valid
  if (!aFormatOk(a_num_nz, a_format)) {
    highsLogUser(options_.log_options, HighsLogType::kError,
                 "Model has illegal constraint matrix format\n");
    return HighsStatus::kError;
  }
  if (!qFormatOk(q_num_nz, q_format)) {
    highsLogUser(options_.log_options, HighsLogType::kError,
                 "Model has illegal Hessian matrix format\n");
    return HighsStatus::kError;
  }
  const bool a_rowwise =
      a_num_nz > 0 ? a_format == (HighsInt)MatrixFormat::kRowwise : false;
  //  if (num_nz) a_rowwise = a_format == (HighsInt)MatrixFormat::kRowwise;

  lp.num_col_ = num_col;
  lp.num_row_ = num_row;
  if (num_col > 0) {
    assert(costs != NULL);
    assert(col_lower != NULL);
    assert(col_upper != NULL);
    lp.col_cost_.assign(costs, costs + num_col);
    lp.col_lower_.assign(col_lower, col_lower + num_col);
    lp.col_upper_.assign(col_upper, col_upper + num_col);
  }
  if (num_row > 0) {
    assert(row_lower != NULL);
    assert(row_upper != NULL);
    lp.row_lower_.assign(row_lower, row_lower + num_row);
    lp.row_upper_.assign(row_upper, row_upper + num_row);
  }
  if (a_num_nz > 0) {
    assert(num_col > 0);
    assert(num_row > 0);
    assert(a_start != NULL);
    assert(a_index != NULL);
    assert(a_value != NULL);
    if (a_rowwise) {
      lp.a_matrix_.start_.assign(a_start, a_start + num_row);
    } else {
      lp.a_matrix_.start_.assign(a_start, a_start + num_col);
    }
    lp.a_matrix_.index_.assign(a_index, a_index + a_num_nz);
    lp.a_matrix_.value_.assign(a_value, a_value + a_num_nz);
  }
  if (a_rowwise) {
    lp.a_matrix_.start_.resize(num_row + 1);
    lp.a_matrix_.start_[num_row] = a_num_nz;
    lp.a_matrix_.format_ = MatrixFormat::kRowwise;
  } else {
    lp.a_matrix_.start_.resize(num_col + 1);
    lp.a_matrix_.start_[num_col] = a_num_nz;
    lp.a_matrix_.format_ = MatrixFormat::kColwise;
  }
  if (sense == (HighsInt)ObjSense::kMaximize) {
    lp.sense_ = ObjSense::kMaximize;
  } else {
    lp.sense_ = ObjSense::kMinimize;
  }
  lp.offset_ = offset;
  if (num_col > 0 && integrality != NULL) {
    lp.integrality_.resize(num_col);
    for (HighsInt iCol = 0; iCol < num_col; iCol++) {
      HighsInt integrality_status = integrality[iCol];
      const bool legal_integrality_status =
          integrality_status == (HighsInt)HighsVarType::kContinuous ||
          integrality_status == (HighsInt)HighsVarType::kInteger ||
          integrality_status == (HighsInt)HighsVarType::kSemiContinuous ||
          integrality_status == (HighsInt)HighsVarType::kSemiInteger;
      if (!legal_integrality_status) {
        highsLogDev(
            options_.log_options, HighsLogType::kError,
            "Model has illegal integer value of %d for integrality[%d]\n",
            (int)integrality_status, iCol);
        return HighsStatus::kError;
      }
      lp.integrality_[iCol] = (HighsVarType)integrality_status;
    }
  }
  if (q_num_nz > 0) {
    assert(num_col > 0);
    assert(q_start != NULL);
    assert(q_index != NULL);
    assert(q_value != NULL);
    HighsHessian& hessian = model.hessian_;
    hessian.dim_ = num_col;
    hessian.format_ = HessianFormat::kTriangular;
    hessian.start_.assign(q_start, q_start + num_col);
    hessian.start_.resize(num_col + 1);
    hessian.start_[num_col] = q_num_nz;
    hessian.index_.assign(q_index, q_index + q_num_nz);
    hessian.value_.assign(q_value, q_value + q_num_nz);
  }
  return passModel(std::move(model));
}